

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::ContainsFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  scalar_function_t *psVar1;
  long lVar2;
  undefined8 *puVar3;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var4;
  byte bVar5;
  ScalarFunctionSet *set;
  ScalarFunction map_fun;
  ScalarFunction list_fun;
  ScalarFunction string_fun;
  string local_740;
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  BaseScalarFunction local_3a8;
  _Any_data _Stack_2f8;
  code *local_2e8;
  undefined8 auStack_2d8 [9];
  element_type *local_290;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  BaseScalarFunction local_280;
  _Any_data _Stack_1d0;
  code *local_1c0;
  undefined8 auStack_1b0 [9];
  element_type *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  BaseScalarFunction local_158;
  _Any_data _Stack_a8;
  code *local_98;
  undefined8 auStack_88 [9];
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar5 = 0;
  GetStringContains();
  ListContainsFun::GetFunction();
  MapContainsFun::GetFunction();
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"contains","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_740);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_4d0,&local_158.super_SimpleFunction);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01999660;
  LogicalType::LogicalType(&local_4d0.super_BaseScalarFunction.return_type,&local_158.return_type);
  local_4d0.super_BaseScalarFunction.stability = local_158.stability;
  local_4d0.super_BaseScalarFunction.null_handling = local_158.null_handling;
  local_4d0.super_BaseScalarFunction.errors = local_158.errors;
  local_4d0.super_BaseScalarFunction.collation_handling = local_158.collation_handling;
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  psVar1 = &local_4d0.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)&_Stack_a8);
  puVar3 = auStack_88;
  pp_Var4 = &local_4d0.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = (bind_scalar_function_t)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_4d0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  local_4d0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_5f8,&local_280.super_SimpleFunction);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01999660;
  LogicalType::LogicalType(&local_5f8.super_BaseScalarFunction.return_type,&local_280.return_type);
  local_5f8.super_BaseScalarFunction.stability = local_280.stability;
  local_5f8.super_BaseScalarFunction.null_handling = local_280.null_handling;
  local_5f8.super_BaseScalarFunction.errors = local_280.errors;
  local_5f8.super_BaseScalarFunction.collation_handling = local_280.collation_handling;
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  psVar1 = &local_5f8.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)&_Stack_1d0);
  puVar3 = auStack_1b0;
  pp_Var4 = &local_5f8.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = (bind_scalar_function_t)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_5f8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_168;
  local_5f8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_160;
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_160->_M_use_count = local_160->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_160->_M_use_count = local_160->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_720,&local_3a8.super_SimpleFunction);
  local_720.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01999660;
  LogicalType::LogicalType(&local_720.super_BaseScalarFunction.return_type,&local_3a8.return_type);
  local_720.super_BaseScalarFunction.stability = local_3a8.stability;
  local_720.super_BaseScalarFunction.null_handling = local_3a8.null_handling;
  local_720.super_BaseScalarFunction.errors = local_3a8.errors;
  local_720.super_BaseScalarFunction.collation_handling = local_3a8.collation_handling;
  local_720.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  psVar1 = &local_720.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)&_Stack_2f8);
  puVar3 = auStack_2d8;
  pp_Var4 = &local_720.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = (bind_scalar_function_t)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_720.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_290;
  local_720.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_288;
  if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_288->_M_use_count = local_288->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_288->_M_use_count = local_288->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_720);
  local_720.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_720.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_720.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_720.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_720.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_720.super_BaseScalarFunction);
  local_3a8.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&_Stack_2f8,&_Stack_2f8,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8);
  local_280.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
  }
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(&_Stack_1d0,&_Stack_1d0,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280);
  local_158.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&_Stack_a8,&_Stack_a8,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ContainsFun::GetFunctions() {
	auto string_fun = GetStringContains();
	auto list_fun = ListContainsFun::GetFunction();
	auto map_fun = MapContainsFun::GetFunction();
	ScalarFunctionSet set("contains");
	set.AddFunction(string_fun);
	set.AddFunction(list_fun);
	set.AddFunction(map_fun);
	return set;
}